

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.cpp
# Opt level: O2

void P_InitTerrainTypes(void)

{
  FTerrainDef *pFVar1;
  FTerrainDef *pFVar2;
  FName FVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  FTextureID index;
  FSplashDef *splashdef;
  int bracedepth;
  FName name;
  FName local_188;
  int lastlump;
  undefined1 local_180 [24];
  PClassActor *local_168;
  PClassActor *pPStack_160;
  undefined8 local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  FScanner sc;
  
  TArray<FSplashDef,_FSplashDef>::Clear(&Splashes);
  TArray<FTerrainDef,_FTerrainDef>::Clear(&Terrains);
  TArray<unsigned_short,_unsigned_short>::Resize(&TerrainTypes.Types,TexMan.Textures.Count + 1);
  memset(TerrainTypes.Types.Array,0xff,(ulong)TerrainTypes.Types.Count * 2);
  sc.ScriptName.Chars = (char *)0x0;
  sc.ScriptOpen = false;
  sc._57_7_ = 0;
  sc.Name.Index = 0;
  sc.Line = 0;
  sc.End = false;
  sc.Crossed = false;
  sc._42_2_ = 0;
  sc.LumpNum = 0;
  sc.Number = 0;
  sc._20_4_ = 0;
  sc.Float = 0.0;
  sc.String = (char *)0x0;
  sc.StringLen = 0;
  sc.TokenType = 0;
  sc.ScriptBuffer.Chars = (char *)0x0;
  FName::operator=((FName *)&sc,"Solid");
  sc.String = (char *)CONCAT44(0xffffffff,sc.String._0_4_);
  TArray<FTerrainDef,_FTerrainDef>::Push(&Terrains,(FTerrainDef *)&sc);
  lastlump = 0;
LAB_004df484:
  iVar7 = FWadCollection::FindLump(&Wads,"TERRAIN",&lastlump,false);
  if (iVar7 == -1) {
    TArray<FSplashDef,_FSplashDef>::ShrinkToFit(&Splashes);
    TArray<FTerrainDef,_FTerrainDef>::ShrinkToFit(&Terrains);
    return;
  }
  FScanner::FScanner(&sc,iVar7);
  iVar7 = 0;
LAB_004df4b4:
  bVar5 = false;
switchD_004df50e_caseD_7:
  do {
    bVar6 = bVar5;
    do {
      bVar4 = FScanner::GetString(&sc);
      if (!bVar4) {
        FScanner::~FScanner(&sc);
        goto LAB_004df484;
      }
      if (!bVar6) {
        iVar8 = FScanner::MustMatchString(&sc,OuterKeywords,8);
        bVar5 = false;
        switch(iVar8) {
        case 0:
          name.Index = 0;
          FScanner::MustGetString(&sc);
          FName::operator=(&name,sc.String);
          local_188.Index = name.Index;
          uVar9 = FindSplash(&local_188);
          uVar10 = uVar9;
          if ((int)uVar9 < 0) {
            local_180._4_4_ = 0;
            local_180._8_4_ = 0;
            SetSplashDefaults((FSplashDef *)local_180);
            local_180._0_4_ = name.Index;
            uVar10 = TArray<FSplashDef,_FSplashDef>::Push(&Splashes,(FSplashDef *)local_180);
          }
          splashdef = Splashes.Array + (int)uVar10;
          FScanner::MustGetString(&sc);
          bVar5 = FScanner::Compare(&sc,"modify");
          if (bVar5) {
            FScanner::MustGetString(&sc);
          }
          else if (-1 < (int)uVar9) {
            SetSplashDefaults(splashdef);
          }
          bVar5 = FScanner::Compare(&sc,"{");
          if (bVar5) {
            local_180._0_4_ = (splashdef->Name).Index;
            GenericParse(&sc,SplashParser,SplashKeywords,splashdef,"splash",(FName *)local_180);
          }
          else {
            FScanner::ScriptError(&sc,"Expected {");
          }
          break;
        case 1:
          name.Index = 0;
          FScanner::MustGetString(&sc);
          FName::operator=(&name,sc.String);
          FVar3 = name;
          local_188.Index = name.Index;
          uVar10 = P_FindTerrain(&local_188);
          if ((int)uVar10 < 0) {
            local_148 = 0.0;
            dStack_140 = 0.0;
            local_158._0_4_ = 0;
            local_158._4_4_ = 0;
            dStack_150 = 0.0;
            local_168 = (PClassActor *)0x0;
            pPStack_160 = (PClassActor *)0x0;
            local_180._8_4_ = 0;
            local_180._12_4_ = 0;
            local_180._16_8_ = (PClassActor *)0x0;
            local_180._4_4_ = -1;
            local_180._0_4_ = FVar3.Index;
            uVar10 = TArray<FTerrainDef,_FTerrainDef>::Push(&Terrains,(FTerrainDef *)local_180);
          }
          FScanner::MustGetString(&sc);
          bVar5 = FScanner::Compare(&sc,"modify");
          pFVar2 = Terrains.Array;
          if (bVar5) {
            FScanner::MustGetString(&sc);
          }
          else {
            name.Index = Terrains.Array[(int)uVar10].Name.Index;
            pFVar1 = Terrains.Array + (int)uVar10;
            pFVar1->Friction = 0.0;
            (&pFVar1->Friction)[1] = 0.0;
            pFVar1 = pFVar2 + (int)uVar10;
            pFVar1->RunStepTics = 0;
            pFVar1->LeftStepSound = 0;
            *(undefined8 *)(&pFVar1->RunStepTics + 2) = 0;
            pFVar2[(int)uVar10].FootClip = 0.0;
            (&pFVar2[(int)uVar10].FootClip)[1] = 0.0;
            pFVar1 = pFVar2 + (int)uVar10;
            pFVar1->DamageAmount = 0;
            pFVar1->DamageMOD = 0;
            *(undefined8 *)(&pFVar1->DamageAmount + 2) = 0;
            pFVar2[(int)uVar10].Splash = -1;
            pFVar2[(int)uVar10].Name.Index = name.Index;
          }
          bVar5 = FScanner::Compare(&sc,"{");
          if (bVar5) {
            local_180._0_4_ = Terrains.Array[(int)uVar10].Name.Index;
            GenericParse(&sc,TerrainParser,TerrainKeywords,Terrains.Array + (int)uVar10,"terrain",
                         (FName *)local_180);
          }
          else {
            FScanner::ScriptError(&sc,"Expected {");
          }
          break;
        case 2:
          bVar5 = FScanner::CheckString(&sc,"optional");
          FScanner::MustGetString(&sc);
          index = FTextureManager::CheckForTexture(&TexMan,sc.String,2,3);
          if (index.texnum < 0) {
            if (!bVar5) {
              Printf("Unknown flat %s\n",sc.String);
            }
            FScanner::MustGetString(&sc);
          }
          else {
            FScanner::MustGetString(&sc);
            FName::FName((FName *)local_180,sc.String);
            iVar8 = P_FindTerrain((FName *)local_180);
            if (iVar8 == -1) {
              iVar8 = 0;
              Printf("Unknown terrain %s\n",sc.String);
            }
            FTerrainTypeArray::Set(&TerrainTypes,index.texnum,iVar8);
          }
          break;
        case 3:
        case 4:
        case 5:
        case 6:
          bVar5 = CheckGame(sc.String + 2,true);
          bVar5 = !bVar5;
        default:
          goto switchD_004df50e_caseD_7;
        case 8:
          FScanner::MustGetString(&sc);
          FName::FName((FName *)local_180,sc.String);
          iVar8 = P_FindTerrain((FName *)local_180);
          if (iVar8 == -1) {
            iVar8 = 0;
            Printf("Unknown terrain %s\n",sc.String);
          }
          DefaultTerrainType = (WORD)iVar8;
        }
        goto LAB_004df4b4;
      }
      if (0 < iVar7) {
        bVar6 = FScanner::Compare(&sc,"}");
        if (!bVar6) goto LAB_004df545;
        iVar7 = iVar7 + -1;
        goto switchD_004df50e_caseD_7;
      }
      bVar4 = FScanner::Compare(&sc,"endif");
      bVar6 = false;
    } while (bVar4);
    bVar5 = true;
LAB_004df545:
    bVar6 = FScanner::Compare(&sc,"{");
    if (bVar6) {
      iVar7 = iVar7 + 1;
    }
    else {
      bVar6 = FScanner::Compare(&sc,"}");
      if (bVar6) {
        FScanner::ScriptError(&sc,"Too many left braces (\'}\')");
      }
    }
  } while( true );
}

Assistant:

void P_InitTerrainTypes ()
{
	int lastlump;
	int lump;
	int size;

	Splashes.Clear();
	Terrains.Clear();
	size = (TexMan.NumTextures()+1);
	TerrainTypes.Resize(size);
	TerrainTypes.Clear();

	MakeDefaultTerrain ();

	lastlump = 0;
	while (-1 != (lump = Wads.FindLump ("TERRAIN", &lastlump)) )
	{
		FScanner sc(lump);
		ParseOuter (sc);
	}
	Splashes.ShrinkToFit ();
	Terrains.ShrinkToFit ();
}